

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

int snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int local_44;
  
  uVar1 = cf->can_id;
  if ((uVar1 >> 0x1d & 1) == 0) {
LAB_0010446c:
    iVar11 = 0;
  }
  else if ((uVar1 & 0x1fffffff) < 0x401) {
    pcVar6 = ",";
    if (sep != (char *)0x0) {
      pcVar6 = sep;
    }
    uVar10 = 0;
    lVar12 = 0;
    local_44 = 0;
    iVar11 = 0;
    do {
      if ((uVar1 >> (uVar10 & 0x1f) & 1) != 0) {
        if (local_44 == 0) {
LAB_0010451f:
          uVar7 = len - (long)iVar11;
          uVar3 = snprintf(buf + iVar11,uVar7,"%s",
                           (long)&error_classes_rel +
                           (long)*(int *)((long)&error_classes_rel + lVar12));
          if ((int)uVar3 < 0 || uVar7 <= uVar3) {
            *buf = '\0';
            bVar2 = false;
          }
          else {
            iVar11 = uVar3 + iVar11;
            if (lVar12 == 4) {
              iVar4 = 0;
              sVar9 = len - (long)iVar11;
              if (sVar9 != 0) {
                iVar4 = snprintf(buf + iVar11,sVar9,"{at bit %d}",(ulong)cf->data[0]);
              }
              iVar11 = iVar11 + iVar4;
            }
            if (lVar12 == 8) {
              iVar4 = 0;
              sVar9 = len - (long)iVar11;
              if (sVar9 != 0) {
                pcVar8 = buf + iVar11;
                iVar4 = snprintf(pcVar8,sVar9,"{");
                iVar5 = snprintf_error_data(pcVar8 + iVar4,sVar9 - (long)iVar4,cf->data[1],
                                            controller_problems,7);
                iVar4 = iVar4 + iVar5;
                iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"}");
                iVar4 = iVar4 + iVar5;
              }
              iVar11 = iVar11 + iVar4;
            }
            if (lVar12 == 0xc) {
              iVar4 = 0;
              sVar9 = len - (long)iVar11;
              if (sVar9 != 0) {
                pcVar8 = buf + iVar11;
                iVar4 = snprintf(pcVar8,sVar9,"{{");
                iVar5 = snprintf_error_data(pcVar8 + iVar4,sVar9 - (long)iVar4,cf->data[2],
                                            protocol_violation_types,8);
                iVar4 = iVar4 + iVar5;
                iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"}{");
                iVar4 = iVar4 + iVar5;
                if ((byte)(cf->data[3] - 1) < 0x1f) {
                  iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"%s",
                                   protocol_violation_locations_rel +
                                   *(int *)(protocol_violation_locations_rel +
                                           (ulong)cf->data[3] * 4));
                  iVar4 = iVar4 + iVar5;
                }
                iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"}}");
                iVar4 = iVar4 + iVar5;
              }
              iVar11 = iVar4 + iVar11;
            }
            if (lVar12 == 0x24) {
              iVar4 = 0;
              sVar9 = len - (long)iVar11;
              if (sVar9 != 0) {
                iVar4 = snprintf(buf + iVar11,sVar9,"{{%d}{%d}}",(ulong)cf->data[6],
                                 (ulong)cf->data[7]);
              }
              iVar11 = iVar11 + iVar4;
            }
            local_44 = local_44 + 1;
            bVar2 = true;
          }
        }
        else {
          uVar7 = len - (long)iVar11;
          uVar3 = snprintf(buf + iVar11,uVar7,"%s",pcVar6);
          if (-1 < (int)uVar3 && uVar3 < uVar7) {
            iVar11 = iVar11 + uVar3;
            goto LAB_0010451f;
          }
          *buf = '\0';
          bVar2 = false;
        }
        if (!bVar2) goto LAB_0010446c;
      }
      lVar12 = lVar12 + 4;
      uVar10 = uVar10 + 1;
    } while (lVar12 != 0x28);
    if (((cf->can_id & 0x200) == 0) && ((cf->data[6] != '\0' || (cf->data[7] != '\0')))) {
      iVar5 = 0;
      iVar4 = snprintf(buf + iVar11,len - (long)iVar11,"%serror-counter-tx-rx",pcVar6);
      iVar11 = iVar11 + iVar4;
      sVar9 = len - (long)iVar11;
      if (sVar9 != 0) {
        iVar5 = snprintf(buf + iVar11,sVar9,"{{%d}{%d}}",(ulong)cf->data[6],(ulong)cf->data[7]);
      }
      iVar11 = iVar5 + iVar11;
    }
  }
  else {
    iVar11 = 0;
    fprintf(_stderr,"Error class %#x is invalid\n");
  }
  return iVar11;
}

Assistant:

int snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return 0;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return 0;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes) {
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
					buf[0] = 0; /* empty terminated string */
					return 0;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
				buf[0] = 0; /* empty terminated string */
				return 0;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			if (mask == CAN_ERR_CNT)
				n += snprintf_error_cnt(buf + n, len - n, cf);
			classes++;
		}
	}

	if (!(cf->can_id & CAN_ERR_CNT) && (cf->data[6] || cf->data[7])) {
		n += snprintf(buf + n, len - n, "%serror-counter-tx-rx", sep);
		n += snprintf_error_cnt(buf + n, len - n, cf);
	}

	return n;
}